

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O2

void __thiscall camp::Property::Property(Property *this,string *name,Type type)

{
  TagHolder::TagHolder(&this->super_TagHolder);
  (this->super_TagHolder)._vptr_TagHolder = (_func_int **)&PTR__Property_001412c8;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  this->m_type = type;
  (this->m_readable).m_getter.
  super___shared_ptr<camp::detail::GetterInterface<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_readable).m_getter.
  super___shared_ptr<camp::detail::GetterInterface<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_readable).m_defaultValue = true;
  (this->m_writable).m_getter.
  super___shared_ptr<camp::detail::GetterInterface<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_writable).m_getter.
  super___shared_ptr<camp::detail::GetterInterface<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_writable).m_defaultValue = true;
  return;
}

Assistant:

Property::Property(const std::string& name, Type type)
    : m_name(name)
    , m_type(type)
    , m_readable(true)
    , m_writable(true)
{
}